

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverCommonCubeCover(Mvc_Cover_t *pCover)

{
  int *piVar1;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pComCube;
  Mvc_Cube_t *pMVar2;
  
  pCover_00 = Mvc_CoverClone(pCover);
  pComCube = Mvc_CubeAlloc(pCover_00);
  Mvc_CoverCommonCube(pCover,pComCube);
  if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar2 = (Mvc_Cube_t *)&pCover_00->lCubes;
  }
  else {
    pMVar2 = (pCover_00->lCubes).pTail;
  }
  pMVar2->pNext = pComCube;
  (pCover_00->lCubes).pTail = pComCube;
  pComCube->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover_00->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverCommonCubeCover( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pRes;
    Mvc_Cube_t * pCube;
    // create the new cover
    pRes = Mvc_CoverClone( pCover );
    // get the new cube
    pCube = Mvc_CubeAlloc( pRes );
    // get the common cube
    Mvc_CoverCommonCube( pCover, pCube );
    // add the cube to the cover
    Mvc_CoverAddCubeTail( pRes, pCube );
    return pRes;
}